

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-reno.c
# Opt level: O0

int reno_on_switch(quicly_cc_t *cc)

{
  quicly_cc_t *in_RDI;
  uint32_t in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_RDI->type == &quicly_cc_type_reno) {
    local_4 = 1;
  }
  else if (in_RDI->type == &quicly_cc_type_pico) {
    in_RDI->type = &quicly_cc_type_reno;
    local_4 = 1;
  }
  else if (in_RDI->type == &quicly_cc_type_cubic) {
    if (in_RDI->cwnd_exiting_slow_start == 0) {
      in_RDI->type = &quicly_cc_type_reno;
    }
    else {
      reno_reset(in_RDI,in_stack_ffffffffffffffec);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int reno_on_switch(quicly_cc_t *cc)
{
    if (cc->type == &quicly_cc_type_reno) {
        return 1; /* nothing to do */
    } else if (cc->type == &quicly_cc_type_pico) {
        cc->type = &quicly_cc_type_reno;
        return 1;
    } else if (cc->type == &quicly_cc_type_cubic) {
        /* When in slow start, state can be reused as-is; otherwise, restart. */
        if (cc->cwnd_exiting_slow_start == 0) {
            cc->type = &quicly_cc_type_reno;
        } else {
            reno_reset(cc, cc->cwnd_initial);
        }
        return 1;
    }

    return 0;
}